

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void insert_rnd_value_of<CB,boost::poly_collection::any_collection<boost::mpl::vector<boost::has_get_data<void(double&),boost::type_erasure::_self>,boost::has_run<void(),boost::type_erasure::_self>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<boost::type_erasure::any<boost::mpl::vector2<boost::mpl::vector<boost::has_get_data<void(double&),boost::type_erasure::_self>,boost::has_run<void(),boost::type_erasure::_self>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::type_erasure::typeid_<boost::type_erasure::_self>>,boost::type_erasure::_self&>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
               (any_collection<boost::mpl::vector<boost::has_get_data<void_(double_&),_boost::type_erasure::_self>,_boost::has_run<void_(),_boost::type_erasure::_self>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<boost::type_erasure::any<boost::mpl::vector2<boost::mpl::vector<boost::has_get_data<void_(double_&),_boost::type_erasure::_self>,_boost::has_run<void_(),_boost::type_erasure::_self>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::type_erasure::typeid_<boost::type_erasure::_self>_>,_boost::type_erasure::_self_&>_>_>
                *c,mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                   *gen,uniform_real_distribution<double> *rnd)

{
  double dVar1;
  iterator iStack_88;
  CB local_70;
  
  dVar1 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (gen);
  local_70.super_CA.super_C.super_B.super_A.data = (rnd->_M_param)._M_a;
  local_70.super_CA.super_C.super_B.super_A.data =
       ((rnd->_M_param)._M_b - local_70.super_CA.super_C.super_B.super_A.data) * dVar1 +
       local_70.super_CA.super_C.super_B.super_A.data;
  local_70.super_CA.super_C.super_B.super_A._vptr_A = (_func_int **)&PTR__A_00128fe8;
  boost::poly_collection::common_impl::
  poly_collection<boost::poly_collection::detail::any_model<boost::mpl::vector<boost::has_get_data<void_(double_&),_boost::type_erasure::_self>,_boost::has_run<void_(),_boost::type_erasure::_self>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_std::allocator<boost::type_erasure::any<boost::mpl::vector2<boost::mpl::vector<boost::has_get_data<void_(double_&),_boost::type_erasure::_self>,_boost::has_run<void_(),_boost::type_erasure::_self>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::type_erasure::typeid_<boost::type_erasure::_self>_>,_boost::type_erasure::_self_&>_>_>
  ::insert<CB,_nullptr>
            (&iStack_88,
             &c->
              super_poly_collection<boost::poly_collection::detail::any_model<boost::mpl::vector<boost::has_get_data<void_(double_&),_boost::type_erasure::_self>,_boost::has_run<void_(),_boost::type_erasure::_self>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_std::allocator<boost::type_erasure::any<boost::mpl::vector2<boost::mpl::vector<boost::has_get_data<void_(double_&),_boost::type_erasure::_self>,_boost::has_run<void_(),_boost::type_erasure::_self>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::type_erasure::typeid_<boost::type_erasure::_self>_>,_boost::type_erasure::_self_&>_>_>
             ,&local_70);
  return;
}

Assistant:

void insert_rnd_value_of( Container& c, E& gen, R &rnd )
{
    c.insert(T{ rnd( gen ) });
}